

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_newell_normal(float *normal,int num_vert,float **vert,int normalize)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  normal[2] = 0.0;
  normal[0] = 0.0;
  normal[1] = 0.0;
  if (num_vert < 1) {
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar8 = 0.0;
  }
  else {
    iVar4 = num_vert + -1;
    fVar6 = 0.0;
    uVar5 = 0;
    fVar7 = 0.0;
    fVar8 = 0.0;
    do {
      pfVar1 = vert[iVar4];
      pfVar2 = vert[uVar5];
      fVar8 = fVar8 + (pfVar1[2] + pfVar2[2]) * (pfVar1[1] - pfVar2[1]);
      *normal = fVar8;
      fVar7 = fVar7 + (*pfVar1 + *pfVar2) * (pfVar1[2] - pfVar2[2]);
      normal[1] = fVar7;
      fVar6 = fVar6 + (pfVar1[1] + pfVar2[1]) * (*pfVar1 - *pfVar2);
      normal[2] = fVar6;
      iVar4 = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while ((uint)num_vert != uVar5);
  }
  if (normalize != 0) {
    fVar3 = 1.0 / SQRT(fVar6 * fVar6 + fVar8 * fVar8 + fVar7 * fVar7);
    *normal = fVar8 * fVar3;
    normal[1] = fVar7 * fVar3;
    normal[2] = fVar6 * fVar3;
  }
  return;
}

Assistant:

void stb_newell_normal(float *normal, int num_vert, float **vert, int normalize)
{
   int i,j;
   float p;
   normal[0] = normal[1] = normal[2] = 0;
   for (i=num_vert-1,j=0; j < num_vert; i=j++) {
      float *u = vert[i];
      float *v = vert[j];
      normal[0] += (u[1] - v[1]) * (u[2] + v[2]);
      normal[1] += (u[2] - v[2]) * (u[0] + v[0]);
      normal[2] += (u[0] - v[0]) * (u[1] + v[1]);
   }
   if (normalize) {
      p = normal[0]*normal[0] + normal[1]*normal[1] + normal[2]*normal[2];
      p = (float) (1.0 / sqrt(p));
      normal[0] *= p;
      normal[1] *= p;
      normal[2] *= p;
   }
}